

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedBools::_InternalSerialize
          (TensorValue_RepeatedBools *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  void *pvVar1;
  LogMessage *other;
  ulong uVar2;
  byte *pbVar3;
  int size;
  uint uVar4;
  uint size_00;
  size_t sVar5;
  byte *ptr;
  LogFinisher local_61;
  LogMessage local_60;
  
  size_00 = (this->values_).current_size_;
  if (0 < (int)size_00) {
    pbVar3 = stream->end_;
    if (pbVar3 <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      size_00 = (this->values_).current_size_;
      pbVar3 = stream->end_;
    }
    if (pbVar3 <= target) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_60,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_61,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_60);
    }
    *target = 10;
    pbVar3 = target + 1;
    uVar2 = (ulong)size_00;
    if (0x7f < size_00) {
      do {
        target = pbVar3;
        uVar4 = (uint)uVar2;
        *target = (byte)uVar2 | 0x80;
        uVar2 = uVar2 >> 7;
        pbVar3 = target + 1;
      } while (0x3fff < uVar4);
    }
    ptr = target + 2;
    *pbVar3 = (byte)uVar2;
    pvVar1 = (this->values_).arena_or_elements_;
    sVar5 = (size_t)(int)size_00;
    if ((long)stream->end_ - (long)ptr < (long)sVar5) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar1,size_00,ptr);
    }
    else {
      memcpy(ptr,pvVar1,sVar5);
      target = ptr + sVar5;
    }
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    uVar2 = uVar2 & 0xfffffffffffffffc;
    pvVar1 = *(void **)(uVar2 + 8);
    size = (int)*(undefined8 *)(uVar2 + 0x10);
    sVar5 = (size_t)size;
    if ((long)stream->end_ - (long)target < (long)sVar5) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar1,size,target);
    }
    else {
      memcpy(target,pvVar1,sVar5);
      target = target + sVar5;
    }
  }
  return target;
}

Assistant:

uint8_t* TensorValue_RepeatedBools::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.MILSpec.TensorValue.RepeatedBools)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated bool values = 1 [packed = true];
  if (this->_internal_values_size() > 0) {
    target = stream->WriteFixedPacked(1, _internal_values(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.MILSpec.TensorValue.RepeatedBools)
  return target;
}